

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O0

int XLearnGetBool(XL *out,char *key,bool *value)

{
  XLearn *this;
  byte *pbVar1;
  int iVar2;
  HyperParam *pHVar3;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  char *in_RSI;
  undefined8 *in_RDI;
  runtime_error *_except_;
  XLearn *xl;
  
  pbVar1 = (byte *)CONCAT71(in_register_00000011,in_DL);
  this = (XLearn *)*in_RDI;
  iVar2 = strcmp(in_RSI,"on_disk");
  if (iVar2 == 0) {
    pHVar3 = XLearn::GetHyperParam(this);
    *pbVar1 = pHVar3->on_disk & 1;
  }
  else {
    iVar2 = strcmp(in_RSI,"quiet");
    if (iVar2 == 0) {
      pHVar3 = XLearn::GetHyperParam(this);
      *pbVar1 = pHVar3->quiet & 1;
    }
    else {
      iVar2 = strcmp(in_RSI,"norm");
      if (iVar2 == 0) {
        pHVar3 = XLearn::GetHyperParam(this);
        *pbVar1 = pHVar3->norm & 1;
      }
      else {
        iVar2 = strcmp(in_RSI,"lock_free");
        if (iVar2 == 0) {
          pHVar3 = XLearn::GetHyperParam(this);
          *pbVar1 = pHVar3->lock_free & 1;
        }
        else {
          iVar2 = strcmp(in_RSI,"early_stop");
          if (iVar2 == 0) {
            pHVar3 = XLearn::GetHyperParam(this);
            *pbVar1 = pHVar3->early_stop & 1;
          }
          else {
            iVar2 = strcmp(in_RSI,"sign");
            if (iVar2 == 0) {
              pHVar3 = XLearn::GetHyperParam(this);
              pHVar3->sign = pbVar1 != (byte *)0x0;
              *pbVar1 = pbVar1 != (byte *)0x0;
            }
            else {
              iVar2 = strcmp(in_RSI,"sigmoid");
              if (iVar2 == 0) {
                pHVar3 = XLearn::GetHyperParam(this);
                *pbVar1 = pHVar3->sigmoid & 1;
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

XL_DLL int XLearnGetBool(XL *out, const char *key, bool *value) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  if (strcmp(key, "on_disk") == 0) {
    *value = xl->GetHyperParam().on_disk;
  } else if (strcmp(key, "quiet") == 0) {
    *value = xl->GetHyperParam().quiet;
  } else if (strcmp(key, "norm") == 0) {
    *value = xl->GetHyperParam().norm;
  } else if (strcmp(key, "lock_free") == 0) {
    *value = xl->GetHyperParam().lock_free;
  } else if (strcmp(key, "early_stop") == 0) {
    *value = xl->GetHyperParam().early_stop;
  } else if (strcmp(key, "sign") == 0) {
    *value = xl->GetHyperParam().sign = value;
  } else if (strcmp(key, "sigmoid") == 0) {
    *value = xl->GetHyperParam().sigmoid;
  }
  API_END();
}